

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump_float(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *this,number_float_t x)

{
  array<char,_64UL> *__s;
  bool bVar1;
  uint uVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  size_t __n;
  char *pcVar3;
  element_type *peVar4;
  long lVar5;
  long lVar6;
  undefined8 uStack_30;
  
  if ((ulong)ABS(x) < 0x7ff0000000000000) {
    __s = &this->number_buffer;
    uVar2 = snprintf(__s->_M_elems,0x40,"%.*g",0xf);
    if ((int)uVar2 < 1) {
      __assert_fail("len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/libs/nlohmann/json.hpp"
                    ,0x1a33,
                    "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_float(number_float_t) [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    if (0x3f < uVar2) {
      __assert_fail("static_cast<std::size_t>(len) < number_buffer.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/libs/nlohmann/json.hpp"
                    ,0x1a35,
                    "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_float(number_float_t) [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    lVar6 = (long)(int)uVar2;
    lVar5 = lVar6;
    if (this->thousands_sep != '\0') {
      pcVar3 = std::__remove_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (__s->_M_elems,__s->_M_elems + lVar6,
                          (_Iter_equals_val<const_char>)&this->thousands_sep);
      __n = (long)this + (0x50 - (long)pcVar3);
      if (__n != 0) {
        memset(pcVar3,0,__n);
      }
      lVar5 = (long)pcVar3 - (long)__s;
      if (lVar6 < lVar5) {
        __assert_fail("(end - number_buffer.begin()) <= len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/libs/nlohmann/json.hpp"
                      ,0x1a3d,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_float(number_float_t) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
    }
    if ((this->decimal_point != '\0') && (this->decimal_point != '.')) {
      pcVar3 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (__s,&this->loc,&this->decimal_point);
      if ((lconv **)pcVar3 != &this->loc) {
        *pcVar3 = '.';
      }
    }
    peVar4 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*peVar4->_vptr_output_adapter_protocol[1])(peVar4,__s,lVar5);
    bVar1 = std::
            none_of<char*,nlohmann::detail::serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>::dump_float(double)::_lambda(char)_1_>
                      (__s,__s->_M_elems + lVar5 + 1);
    if (!bVar1) {
      return;
    }
    peVar4 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    UNRECOVERED_JUMPTABLE = peVar4->_vptr_output_adapter_protocol[1];
    pcVar3 = ".0";
    uStack_30 = 2;
  }
  else {
    peVar4 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    UNRECOVERED_JUMPTABLE = peVar4->_vptr_output_adapter_protocol[1];
    pcVar3 = "null";
    uStack_30 = 4;
  }
  (*UNRECOVERED_JUMPTABLE)(peVar4,pcVar3,uStack_30);
  return;
}

Assistant:

void dump_float(number_float_t x)
    {
        // NaN / inf
        if (not std::isfinite(x) or std::isnan(x))
        {
            o->write_characters("null", 4);
            return;
        }

        // get number of digits for a text -> float -> text round-trip
        static constexpr auto d = std::numeric_limits<number_float_t>::digits10;

        // the actual conversion
        std::ptrdiff_t len = snprintf(number_buffer.data(), number_buffer.size(), "%.*g", d, x);

        // negative value indicates an error
        assert(len > 0);
        // check if buffer was large enough
        assert(static_cast<std::size_t>(len) < number_buffer.size());

        // erase thousands separator
        if (thousands_sep != '\0')
        {
            const auto end = std::remove(number_buffer.begin(),
                                         number_buffer.begin() + len, thousands_sep);
            std::fill(end, number_buffer.end(), '\0');
            assert((end - number_buffer.begin()) <= len);
            len = (end - number_buffer.begin());
        }

        // convert decimal point to '.'
        if (decimal_point != '\0' and decimal_point != '.')
        {
            const auto dec_pos = std::find(number_buffer.begin(), number_buffer.end(), decimal_point);
            if (dec_pos != number_buffer.end())
            {
                *dec_pos = '.';
            }
        }

        o->write_characters(number_buffer.data(), static_cast<std::size_t>(len));

        // determine if need to append ".0"
        const bool value_is_int_like =
            std::none_of(number_buffer.begin(), number_buffer.begin() + len + 1,
                         [](char c)
        {
            return (c == '.' or c == 'e');
        });

        if (value_is_int_like)
        {
            o->write_characters(".0", 2);
        }
    }